

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# aspa.c
# Opt level: O3

aspa_status
aspa_table_update_in_place_undo
          (aspa_table *aspa_table,rtr_socket *rtr_socket,aspa_update_operation *operations,
          size_t count,aspa_update_operation *failed_operation)

{
  aspa_update_operation *paVar1;
  long lVar2;
  aspa_array *array;
  aspa_status aVar3;
  aspa_store_node *paVar4;
  ulong uVar5;
  aspa_record *paVar6;
  aspa_update_operation *paVar7;
  ulong index;
  ulong uVar8;
  size_t *psVar9;
  long in_FS_OFFSET;
  bool bVar10;
  bool bVar11;
  aspa_status local_68;
  
  lVar2 = *(long *)(in_FS_OFFSET + 0x28);
  if (aspa_table == (aspa_table *)0x0) {
    __assert_fail("aspa_table",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37b,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (rtr_socket == (rtr_socket *)0x0) {
    __assert_fail("rtr_socket",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x37c,
                  "enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  if (count == 0 || operations == (aspa_update_operation *)0x0) {
    local_68 = -(uint)(operations == (aspa_update_operation *)0x0 && count != 0);
    goto LAB_0010e4b8;
  }
  if (operations == (aspa_update_operation *)0x0) {
    __assert_fail("operations",
                  "/workspace/llm4binary/github/license_c_cmakelists/rtrlib[P]rtrlib/rtrlib/aspa/aspa.c"
                  ,0x2fe,
                  "enum aspa_status aspa_table_update_in_place_undo_internal(struct aspa_table *, struct rtr_socket *, struct aspa_update_operation *, size_t, struct aspa_update_operation *)"
                 );
  }
  pthread_rwlock_wrlock((pthread_rwlock_t *)aspa_table);
  for (paVar4 = aspa_table->store; paVar4 != (aspa_store_node *)0x0; paVar4 = paVar4->next) {
    if (paVar4->rtr_socket == rtr_socket) {
      array = paVar4->aspa_array;
      if (array != (aspa_array *)0x0) {
        uVar5 = (ulong)array->size;
        if (array->size == 0) {
          local_68 = ASPA_SUCCESS;
          goto LAB_0010e492;
        }
        index = 0;
        uVar8 = 0;
        goto LAB_0010e2b4;
      }
      break;
    }
  }
  local_68 = ASPA_ERROR;
  goto LAB_0010e492;
  while( true ) {
    while ((index < uVar5 &&
           (paVar6 = aspa_array_get_record(array,index),
           paVar6->customer_asn < (paVar1->record).customer_asn))) {
      index = index + 1;
      uVar5 = (ulong)array->size;
    }
    paVar6 = aspa_array_get_record(array,index);
    if (paVar6 == (aspa_record *)0x0) {
      bVar10 = false;
    }
    else {
      bVar10 = paVar6->customer_asn == (paVar1->record).customer_asn;
    }
    if (uVar8 < count - 1) {
      bVar11 = operations[uVar8 + 1].record.customer_asn == (paVar1->record).customer_asn;
    }
    else {
      bVar11 = false;
    }
    if (paVar1->type == ASPA_REMOVE) {
      if (((bool)(bVar11 & bVar10)) && (paVar7->type == ASPA_ADD)) {
        if (paVar6->provider_asns != (uint32_t *)0x0) {
          lrtr_free(paVar6->provider_asns);
        }
        paVar6->provider_asns = (paVar1->record).provider_asns;
        paVar6->provider_count = (paVar1->record).provider_count;
        aspa_table_notify_clients(aspa_table,&paVar7->record,rtr_socket,ASPA_REMOVE);
        uVar8 = uVar8 + 1;
      }
      else {
        if (bVar10) {
          local_68 = ASPA_DUPLICATE_RECORD;
          goto LAB_0010e492;
        }
        aVar3 = aspa_array_insert(array,index,&paVar1->record,false);
        if (aVar3 != ASPA_SUCCESS) {
          local_68 = ASPA_ERROR;
          goto LAB_0010e492;
        }
      }
      aspa_table_notify_clients(aspa_table,&paVar1->record,rtr_socket,ASPA_ADD);
      (paVar1->record).provider_count = 0;
      (paVar1->record).provider_asns = (uint32_t *)0x0;
    }
    else if (paVar1->type == ASPA_ADD) {
      if (!bVar10) {
        local_68 = ASPA_RECORD_NOT_FOUND;
        goto LAB_0010e492;
      }
      if ((bVar11) && (paVar7->type == ASPA_REMOVE)) {
        paVar1->is_no_op = true;
        paVar7->is_no_op = true;
        uVar8 = uVar8 + 1;
      }
      else {
        local_68 = ASPA_RECORD_NOT_FOUND;
        aVar3 = aspa_array_remove(array,index,true);
        if (aVar3 != ASPA_SUCCESS) goto LAB_0010e492;
        aspa_table_notify_clients(aspa_table,&paVar1->record,rtr_socket,ASPA_REMOVE);
      }
    }
    uVar8 = uVar8 + 1;
    uVar5 = (ulong)array->size;
    if (uVar5 <= uVar8) break;
LAB_0010e2b4:
    paVar1 = operations + uVar8;
    paVar7 = (aspa_update_operation *)0x0;
    if (uVar8 < count - 1) {
      paVar7 = operations + uVar8 + 1;
    }
    if ((failed_operation != (aspa_update_operation *)0x0) && (paVar1 == failed_operation)) break;
  }
  local_68 = ASPA_SUCCESS;
LAB_0010e492:
  pthread_rwlock_unlock((pthread_rwlock_t *)aspa_table);
  psVar9 = &(operations->record).provider_count;
  do {
    if (*(char *)(psVar9 + -2) == '\0') {
      *psVar9 = 0;
      psVar9[1] = 0;
    }
    psVar9 = psVar9 + 6;
    count = count - 1;
  } while (count != 0);
LAB_0010e4b8:
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar2) {
    __stack_chk_fail();
  }
  return local_68;
}

Assistant:

enum aspa_status aspa_table_update_in_place_undo(struct aspa_table *aspa_table, struct rtr_socket *rtr_socket,
						 struct aspa_update_operation *operations, size_t count,
						 struct aspa_update_operation *failed_operation)
{
	// Fail hard in debug builds.
	assert(aspa_table);
	assert(rtr_socket);

	if (!aspa_table || !rtr_socket || ((count > 0) && !operations))
		return ASPA_ERROR;

	if (count == 0)
		return ASPA_SUCCESS;

	enum aspa_status res =
		aspa_table_update_in_place_undo_internal(aspa_table, rtr_socket, operations, count, failed_operation);

	for (size_t i = 0; i < count; i++) {
		struct aspa_update_operation *op = &operations[i];

		// If it's a remove operation, we inserted a reference to the removed record's providers.
		// Restore that 'remove' operation back to its original state.
		if (op->type == ASPA_REMOVE) {
			op->record.provider_asns = NULL;
			op->record.provider_count = 0;
		}
	}

	return res;
}